

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_semacheck2.c
# Opt level: O0

_Bool gravity_semacheck2(gnode_t *node,gravity_delegate_t *delegate)

{
  undefined1 local_110 [8];
  gvisitor_t visitor;
  semacheck_t data;
  gravity_delegate_t *delegate_local;
  gnode_t *node_local;
  
  memset(&visitor.visit_postfix_expr,0,0x28);
  visitor.visit_postfix_expr =
       (_func_void_gvisitor_ptr_gnode_postfix_expr_t_ptr *)gnode_array_create();
  local_110._0_4_ = 0;
  visitor._0_8_ = &visitor.visit_postfix_expr;
  visitor.data._0_1_ = 0;
  visitor.delegate = (void *)0x0;
  visitor.visit_pre = (_func_void_gvisitor_ptr_gnode_t_ptr *)0x0;
  visitor.visit_post = visit_list_stmt;
  visitor.visit_list_stmt = visit_compound_stmt;
  visitor.visit_compound_stmt = visit_label_stmt;
  visitor.visit_label_stmt = visit_flow_stmt;
  visitor.visit_flow_stmt = visit_jump_stmt;
  visitor.visit_jump_stmt = visit_loop_stmt;
  visitor.visit_loop_stmt = visit_empty_stmt;
  visitor.visit_empty_stmt = visit_function_decl;
  visitor.visit_function_decl = visit_variable_decl;
  visitor.visit_variable_decl = visit_enum_decl;
  visitor.visit_enum_decl = visit_class_decl;
  visitor.visit_class_decl = visit_module_decl;
  visitor.visit_module_decl = visit_binary_expr;
  visitor.visit_binary_expr = visit_unary_expr;
  visitor.visit_unary_expr = visit_file_expr;
  visitor.visit_file_expr = visit_literal_expr;
  visitor.visit_literal_expr = visit_identifier_expr;
  visitor.visit_identifier_expr = visit_keyword_expr;
  visitor.visit_keyword_expr = visit_list_expr;
  visitor.visit_list_expr = visit_postfix_expr;
  visitor._16_8_ = delegate;
  gvisit((gvisitor_t *)local_110,node);
  if (*(long *)(visitor.visit_postfix_expr + 0x10) != 0) {
    free(*(void **)(visitor.visit_postfix_expr + 0x10));
  }
  free(visitor.visit_postfix_expr);
  return local_110._0_4_ == 0;
}

Assistant:

bool gravity_semacheck2 (gnode_t *node, gravity_delegate_t *delegate) {
    semacheck_t data = {.declarations = gnode_array_create(), .lasterror = 0};
    marray_init(data.statements);

    gvisitor_t visitor = {
        .nerr = 0,                            // used to store number of found errors
        .data = (void *)&data,                // used to store a pointer to the semantic check struct
        .delegate = (void *)delegate,        // compiler delegate to report errors

        // COMMON
        .visit_pre = NULL,
        .visit_post = NULL,

        // STATEMENTS: 7
        .visit_list_stmt = visit_list_stmt,
        .visit_compound_stmt = visit_compound_stmt,
        .visit_label_stmt = visit_label_stmt,
        .visit_flow_stmt = visit_flow_stmt,
        .visit_loop_stmt = visit_loop_stmt,
        .visit_jump_stmt = visit_jump_stmt,
        .visit_empty_stmt = visit_empty_stmt,

        // DECLARATIONS: 5
        .visit_function_decl = visit_function_decl,
        .visit_variable_decl = visit_variable_decl,
        .visit_enum_decl = visit_enum_decl,
        .visit_class_decl = visit_class_decl,
        .visit_module_decl = visit_module_decl,

        // EXPRESSIONS: 8
        .visit_binary_expr = visit_binary_expr,
        .visit_unary_expr = visit_unary_expr,
        .visit_file_expr = visit_file_expr,
        .visit_literal_expr = visit_literal_expr,
        .visit_identifier_expr = visit_identifier_expr,
        .visit_keyword_expr = visit_keyword_expr,
        .visit_list_expr = visit_list_expr,
        .visit_postfix_expr = visit_postfix_expr,
    };

    DEBUG_SEMA2("=== SEMANTIC CHECK STEP 2 ===");
    gvisit(&visitor, node);
    DEBUG_SEMA2("\n");

    marray_destroy(data.statements);
    gnode_array_free(data.declarations);
    return (visitor.nerr == 0);
}